

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_constraint.cpp
# Opt level: O2

string * __thiscall
duckdb::UniqueConstraint::ToString_abi_cxx11_(string *__return_storage_ptr__,UniqueConstraint *this)

{
  const_reference text;
  ulong __n;
  char *pcVar1;
  string base;
  string local_50;
  
  pcVar1 = "UNIQUE(";
  if (this->is_primary_key != false) {
    pcVar1 = "PRIMARY KEY(";
  }
  ::std::__cxx11::string::string((string *)&base,pcVar1,(allocator *)&local_50);
  for (__n = 0; __n < (ulong)((long)(this->columns).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->columns).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1)
  {
    if (__n != 0) {
      ::std::__cxx11::string::append((char *)&base);
    }
    text = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::get<true>(&this->columns,__n);
    KeywordHelper::WriteOptionallyQuoted(&local_50,text,'\"',true);
    ::std::__cxx11::string::append((string *)&base);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::operator+(__return_storage_ptr__,&base,")");
  ::std::__cxx11::string::~string((string *)&base);
  return __return_storage_ptr__;
}

Assistant:

string UniqueConstraint::ToString() const {
	string base = is_primary_key ? "PRIMARY KEY(" : "UNIQUE(";
	for (idx_t i = 0; i < columns.size(); i++) {
		if (i > 0) {
			base += ", ";
		}
		base += KeywordHelper::WriteOptionallyQuoted(columns[i]);
	}
	return base + ")";
}